

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astSwitchNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  sysbvm_tuple_t sVar7;
  sysbvm_object_tuple_t *psVar8;
  undefined8 *puVar9;
  long *plVar10;
  sysbvm_tuple_t sVar11;
  sysbvm_tuple_t slotCount;
  sysbvm_object_tuple_t *local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_object_tuple_t *psStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  psStack_60 = (sysbvm_object_tuple_t *)0x0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = (sysbvm_object_tuple_t *)0x0;
  sStack_80 = 0;
  local_58 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 7;
  puStack_30 = (undefined1 *)&local_88;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_78 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                       (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                        *(sysbvm_tuple_t *)(*arguments + 0x28));
  uVar1 = *(ulong *)(*arguments + 0x30);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    slotCount = 0;
  }
  sStack_70 = sysbvm_array_create(context,slotCount);
  local_68 = sysbvm_array_create(context,slotCount);
  if (slotCount != 0) {
    sVar11 = 0;
    do {
      sVar7 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                        (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                         *(sysbvm_tuple_t *)
                          (*(long *)(*(long *)(*arguments + 0x30) + 0x10 + sVar11 * 8) + 0x28));
      if ((sStack_70 & 0xf) == 0 && sStack_70 != 0) {
        *(sysbvm_tuple_t *)(sStack_70 + 0x10 + sVar11 * 8) = sVar7;
      }
      psVar8 = sysbvm_context_allocatePointerTuple
                         (context,(context->roots).functionBytecodeAssemblerLabel,7);
      if ((local_68 & 0xf) == 0 && local_68 != 0) {
        *(sysbvm_object_tuple_t **)(local_68 + 0x10 + sVar11 * 8) = psVar8;
      }
      sVar11 = sVar11 + 1;
    } while (slotCount != sVar11);
  }
  psStack_60 = sysbvm_context_allocatePointerTuple
                         (context,(context->roots).functionBytecodeAssemblerLabel,7);
  local_88 = sysbvm_context_allocatePointerTuple
                       (context,(context->roots).functionBytecodeAssemblerLabel,7);
  sysbvm_functionBytecodeAssembler_caseJump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_78,
             sStack_70,local_68,(sysbvm_tuple_t)psStack_60);
  sStack_80 = sysbvm_functionBytecodeAssembler_newTemporary
                        (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                         *(sysbvm_tuple_t *)(*arguments + 0x20));
  if (slotCount != 0) {
    sVar11 = 0;
    do {
      lVar2 = *(long *)(*(long *)(*arguments + 0x30) + 0x10 + sVar11 * 8);
      lVar3 = *(long *)(local_68 + 0x10 + sVar11 * 8);
      lVar4 = *(long *)(arguments[1] + 0x10);
      lVar5 = *(long *)(lVar4 + 0x50);
      *(long *)(lVar3 + 0x20) = lVar5;
      plVar10 = (long *)(lVar5 + 0x28);
      if (lVar5 == 0) {
        plVar10 = (long *)(lVar4 + 0x48);
      }
      *plVar10 = lVar3;
      *(long *)(lVar4 + 0x50) = lVar3;
      *(undefined8 *)(lVar3 + 0x40) = *(undefined8 *)(lVar4 + 0x68);
      *(undefined8 *)(lVar3 + 0x38) = *(undefined8 *)(lVar4 + 0x60);
      *(undefined8 *)(lVar3 + 0x30) = *(undefined8 *)(lVar4 + 0x58);
      sVar7 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                        (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                         *(sysbvm_tuple_t *)(lVar2 + 0x30));
      sysbvm_functionBytecodeAssembler_move
                (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_80,
                 sVar7);
      sysbvm_functionBytecodeAssembler_jump
                (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                 (sysbvm_tuple_t)local_88);
      sVar11 = sVar11 + 1;
    } while (slotCount != sVar11);
  }
  lVar2 = *(long *)(arguments[1] + 0x10);
  lVar3 = *(long *)(lVar2 + 0x50);
  psStack_60[1].header.identityHashAndFlags = (int)lVar3;
  psStack_60[1].header.objectSize = (int)((ulong)lVar3 >> 0x20);
  puVar9 = (undefined8 *)(lVar3 + 0x28);
  if (lVar3 == 0) {
    puVar9 = (undefined8 *)(lVar2 + 0x48);
  }
  *puVar9 = psStack_60;
  *(sysbvm_object_tuple_t **)(lVar2 + 0x50) = psStack_60;
  psStack_60[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(lVar2 + 0x68);
  uVar6 = *(undefined8 *)(lVar2 + 0x60);
  psStack_60[2].header.identityHashAndFlags = (int)uVar6;
  psStack_60[2].header.objectSize = (int)((ulong)uVar6 >> 0x20);
  psStack_60[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(lVar2 + 0x58);
  if (*(sysbvm_tuple_t *)(*arguments + 0x38) == 0) {
    local_58 = sysbvm_functionBytecodeAssembler_addLiteral
                         (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->
                                  assembler,0);
  }
  else {
    local_58 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                          *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_move
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sStack_80,
             local_58);
  lVar2 = *(long *)(arguments[1] + 0x10);
  lVar3 = *(long *)(lVar2 + 0x50);
  local_88[1].header.identityHashAndFlags = (int)lVar3;
  local_88[1].header.objectSize = (int)((ulong)lVar3 >> 0x20);
  puVar9 = (undefined8 *)(lVar3 + 0x28);
  if (lVar3 == 0) {
    puVar9 = (undefined8 *)(lVar2 + 0x48);
  }
  *puVar9 = local_88;
  *(sysbvm_object_tuple_t **)(lVar2 + 0x50) = local_88;
  local_88[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(lVar2 + 0x68);
  uVar6 = *(undefined8 *)(lVar2 + 0x60);
  local_88[2].header.identityHashAndFlags = (int)uVar6;
  local_88[2].header.objectSize = (int)((ulong)uVar6 >> 0x20);
  local_88[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(lVar2 + 0x58);
  return sStack_80;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSwitchNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astSwitchNode_t **switchNode = (sysbvm_astSwitchNode_t**)node;
    struct {
        sysbvm_tuple_t mergeLabel;
        sysbvm_tuple_t result;
        sysbvm_tuple_t value;
        sysbvm_tuple_t keyList;
        sysbvm_tuple_t caseLabelList;
        sysbvm_tuple_t defaultLabel;
        sysbvm_tuple_t defaultResult;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    // Emit the value.
    gcFrame.value = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*switchNode)->expression);

    // Emit the keys.
    size_t caseCount = sysbvm_array_getSize((*switchNode)->caseExpressions);
    gcFrame.keyList = sysbvm_array_create(context, caseCount);
    gcFrame.caseLabelList = sysbvm_array_create(context, caseCount);
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_astCaseNode_t *caseNode = (sysbvm_astCaseNode_t*)sysbvm_array_at((*switchNode)->caseExpressions, i);
        sysbvm_tuple_t caseKey = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, caseNode->keyExpression);
        sysbvm_array_atPut(gcFrame.keyList, i, caseKey);

        sysbvm_tuple_t caseLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
        sysbvm_array_atPut(gcFrame.caseLabelList, i, caseLabel);
    }

    gcFrame.defaultLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.mergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // Emit the switch.
    sysbvm_functionBytecodeAssembler_caseJump(context, (*compiler)->assembler, gcFrame.value, gcFrame.keyList, gcFrame.caseLabelList, gcFrame.defaultLabel);

    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*switchNode)->super.analyzedType);

    // Emit the different cases.
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_astCaseNode_t *caseNode = (sysbvm_astCaseNode_t*)sysbvm_array_at((*switchNode)->caseExpressions, i);
        sysbvm_tuple_t caseLabel = sysbvm_array_at(gcFrame.caseLabelList, i);
        sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, caseLabel);

        sysbvm_tuple_t caseValue = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, caseNode->valueExpression);
        sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, caseValue);
        sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.mergeLabel);
    }

    // Emit the default case.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.defaultLabel);
    if((*switchNode)->defaultExpression)
        gcFrame.defaultResult = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*switchNode)->defaultExpression);
    else
        gcFrame.defaultResult = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);
    sysbvm_functionBytecodeAssembler_move(context, (*compiler)->assembler, gcFrame.result, gcFrame.defaultResult);

    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.mergeLabel);
    return gcFrame.result;
}